

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O2

void do_jump(jmp_buf *exceptionJump,void *expected,void *actual)

{
  longjmp((__jmp_buf_tag *)exceptionJump,0xca1e4);
}

Assistant:

void do_jump(jmp_buf *exceptionJump, const volatile void* expected, const volatile void* actual)
{
    /*setting a breakpoint here allows catching the jump before it happens*/
    (void)expected;
    (void)actual;
#if CTEST_ABORT_ON_FAIL
    (void)exceptionJump;
    abort();
#else
    longjmp(*exceptionJump, 0xca1e4);
#endif
}